

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O0

void __thiscall kratos::FSM::FSM(FSM *this,string *name,Generator *generator)

{
  Generator *pGVar1;
  bool bVar2;
  UserException *pUVar3;
  undefined1 local_d8 [56];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  undefined1 local_88 [56];
  undefined1 local_50 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vars;
  int local_24;
  Generator *local_20;
  Generator *generator_local;
  string *name_local;
  FSM *this_local;
  
  local_20 = generator;
  generator_local = (Generator *)name;
  name_local = &this->fsm_name_;
  std::__cxx11::string::string((string *)this,(string *)name);
  this->generator_ = local_20;
  std::
  unordered_map<kratos::Var_*,_kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>_>
  ::unordered_map(&this->outputs_);
  std::shared_ptr<kratos::Var>::shared_ptr(&this->clk_,(nullptr_t)0x0);
  std::shared_ptr<kratos::Var>::shared_ptr(&this->reset_,(nullptr_t)0x0);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FSMState>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FSMState>_>_>_>
  ::map(&this->states_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->state_names_);
  std::shared_ptr<kratos::FSMState>::shared_ptr(&this->start_state_,(nullptr_t)0x0);
  local_24 = 0;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[1],_int,_true>(&this->start_state_debug_,(char (*) [1])0x45aa19,&local_24);
  this->current_state_ = (EnumVar *)0x0;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  ::unordered_map(&this->fn_name_ln_);
  this->realized_ = false;
  this->moore_ = true;
  this->reset_high_ = true;
  this->parent_fsm_ = (FSM *)0x0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::FSM_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::FSM_*>_>_>
  ::map(&this->child_fsms_);
  Generator::get_ports_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_50,local_20,Clock);
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_50);
  if (bVar2) {
    local_88[0x17] = 1;
    pUVar3 = (UserException *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_88 + 0x18),"Unable to find any clock signal in ",&local_20->instance_name)
    ;
    UserException::UserException(pUVar3,(string *)(local_88 + 0x18));
    local_88[0x17] = 0;
    __cxa_throw(pUVar3,&UserException::typeinfo,UserException::~UserException);
  }
  pGVar1 = this->generator_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_50,0);
  Generator::get_port((Generator *)local_88,(string *)pGVar1);
  std::shared_ptr<kratos::Var>::operator=(&this->clk_,(shared_ptr<kratos::Port> *)local_88);
  std::shared_ptr<kratos::Port>::~shared_ptr((shared_ptr<kratos::Port> *)local_88);
  Generator::get_ports_abi_cxx11_(&local_a0,local_20,AsyncReset);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_50,&local_a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a0);
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_50);
  if (!bVar2) {
    pGVar1 = this->generator_;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_50,0);
    Generator::get_port((Generator *)local_d8,(string *)pGVar1);
    std::shared_ptr<kratos::Var>::operator=(&this->reset_,(shared_ptr<kratos::Port> *)local_d8);
    std::shared_ptr<kratos::Port>::~shared_ptr((shared_ptr<kratos::Port> *)local_d8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_50);
    return;
  }
  local_d8[0x17] = 1;
  pUVar3 = (UserException *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_d8 + 0x18),"Unable to find any reset signal in ",&local_20->instance_name);
  UserException::UserException(pUVar3,(string *)(local_d8 + 0x18));
  local_d8[0x17] = 0;
  __cxa_throw(pUVar3,&UserException::typeinfo,UserException::~UserException);
}

Assistant:

FSM::FSM(std::string name, kratos::Generator* generator)
    : fsm_name_(std::move(name)), generator_(generator) {
    // find the first clock signal
    auto vars = generator->get_ports(PortType::Clock);
    if (vars.empty()) {
        throw UserException("Unable to find any clock signal in " + generator->instance_name);
    }
    clk_ = generator_->get_port(vars[0]);
    // find the reset signal
    vars = generator->get_ports(PortType::AsyncReset);
    if (vars.empty()) {
        throw UserException("Unable to find any reset signal in " + generator->instance_name);
    }
    reset_ = generator_->get_port(vars[0]);
}